

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxplus.cpp
# Opt level: O1

void __thiscall libDAI::MaxPlus::calcNewMessage(MaxPlus *this,size_t iI)

{
  ulong *puVar1;
  undefined1 auVar2 [16];
  long lVar3;
  pointer pvVar4;
  pointer pTVar5;
  FactorGraph *pFVar6;
  long lVar7;
  pointer pdVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  ulong uVar16;
  size_t sVar17;
  int iVar18;
  undefined4 extraout_var;
  ostream *poVar20;
  long lVar21;
  long lVar22;
  Var *n;
  VarSet *ns;
  long *plVar23;
  ulong uVar24;
  long lVar25;
  size_t i;
  long lVar26;
  long *plVar27;
  long lVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  double dVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 in_XMM4 [16];
  Prob sum;
  Index i_newm;
  allocator_type local_d9;
  MaxPlus *local_d8;
  long *local_d0;
  vector<double,_std::allocator<double>_> local_c8;
  size_t local_b0;
  long local_a8;
  VarSet local_a0;
  Index local_80;
  long *plVar19;
  
  iVar18 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[4])();
  plVar19 = (long *)CONCAT44(extraout_var,iVar18);
  lVar3 = *(long *)(plVar19[8] + iI * 0x10);
  lVar25 = *(long *)(plVar19[8] + 8 + iI * 0x10);
  local_d8 = this;
  local_d0 = plVar19;
  local_b0 = iI;
  if (5 < (this->Props).verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"new Mess F",10);
    poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20," -> v",5);
    poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
    plVar19 = local_d0;
    std::ostream::put((char)poVar20);
    std::ostream::flush();
  }
  lVar21 = (**(code **)(*plVar19 + 0x50))(plVar19,lVar25);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_c8,(vector<double,_std::allocator<double>_> *)(lVar21 + 0x20));
  lVar21 = lVar25 * 3;
  plVar27 = *(long **)(plVar19[0x11] + lVar25 * 0x18);
  lVar22 = lVar21;
  if (plVar27 != *(long **)(plVar19[0x11] + 8 + lVar25 * 0x18)) {
    do {
      local_a8 = lVar22;
      if (*plVar27 != lVar3) {
        lVar21 = *(long *)(*(long *)&(local_d8->_g->_fg)._E12ind.
                                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[*plVar27].
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data + lVar25 * 8);
        pvVar4 = (local_d8->_indices).
                 super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar22 = (**(code **)(*plVar19 + 0x30))(plVar19,*plVar27);
        local_a0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&local_80,*(size_type *)(lVar22 + 8),
                   (value_type_conflict3 *)&local_a0,&local_d9);
        lVar22 = *plVar27;
        plVar23 = *(long **)(plVar19[0xe] + lVar22 * 0x18);
        plVar19 = *(long **)(plVar19[0xe] + 8 + lVar22 * 0x18);
        if (plVar23 != plVar19) {
          pTVar5 = (local_d8->_messages).
                   super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pFVar6 = local_d8->_g;
          lVar28 = (long)local_80._count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start - local_80._index >> 3;
          do {
            if (*plVar23 != lVar25 &&
                local_80._count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)local_80._index) {
              lVar7 = *(long *)&pTVar5[*(long *)(*(long *)&(pFVar6->_fg)._E12ind.
                                                                                                                      
                                                  super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[lVar22].
                                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                                  ._M_impl.super__Vector_impl_data + *plVar23 * 8)].
                                _p.super__Vector_base<double,_std::allocator<double>_>._M_impl;
              lVar26 = 0;
              do {
                *(double *)(local_80._index + lVar26 * 2 * 4) =
                     *(double *)(lVar7 + lVar26 * 8) + *(double *)(local_80._index + lVar26 * 2 * 4)
                ;
                lVar26 = lVar26 + 1;
              } while (lVar28 + (ulong)(lVar28 == 0) != lVar26);
            }
            plVar23 = plVar23 + 1;
          } while (plVar23 != plVar19);
        }
        if ((long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start != 0) {
          lVar22 = (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 3;
          lVar21 = *(long *)&pvVar4[lVar21].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data;
          lVar28 = 0;
          do {
            local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar28] =
                 *(double *)(local_80._index + *(long *)(lVar21 + lVar28 * 8) * 2 * 4) +
                 local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar28];
            lVar28 = lVar28 + 1;
          } while (lVar22 + (ulong)(lVar22 == 0) != lVar28);
        }
        lVar21 = local_a8;
        plVar19 = local_d0;
        if ((pointer)local_80._index != (pointer)0x0) {
          operator_delete((void *)local_80._index,
                          (long)local_80._count.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - local_80._index);
          lVar21 = local_a8;
          plVar19 = local_d0;
        }
      }
      plVar27 = plVar27 + 1;
      lVar22 = local_a8;
    } while (plVar27 != *(long **)(plVar19[0x11] + 8 + lVar21 * 8));
  }
  sVar17 = local_b0;
  pTVar5 = (local_d8->_newmessages).
           super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar21 = *(long *)&pTVar5[local_b0]._p.super__Vector_base<double,_std::allocator<double>_>._M_impl
  ;
  lVar22 = (long)pTVar5[local_b0]._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish - lVar21;
  if (lVar22 != 0) {
    lVar22 = lVar22 >> 3;
    auVar29 = vpbroadcastq_avx512f();
    uVar24 = 0;
    auVar30 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar31 = vbroadcastsd_avx512f(ZEXT816(0xfff0000000000000));
    do {
      auVar32 = vpbroadcastq_avx512f();
      auVar32 = vporq_avx512f(auVar32,auVar30);
      uVar16 = vpcmpuq_avx512f(auVar32,auVar29,2);
      puVar1 = (ulong *)(lVar21 + uVar24 * 8);
      bVar9 = (bool)((byte)uVar16 & 1);
      bVar10 = (bool)((byte)(uVar16 >> 1) & 1);
      bVar11 = (bool)((byte)(uVar16 >> 2) & 1);
      bVar12 = (bool)((byte)(uVar16 >> 3) & 1);
      bVar13 = (bool)((byte)(uVar16 >> 4) & 1);
      bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
      bVar15 = (bool)((byte)(uVar16 >> 6) & 1);
      *puVar1 = (ulong)bVar9 * auVar31._0_8_ | (ulong)!bVar9 * *puVar1;
      puVar1[1] = (ulong)bVar10 * auVar31._8_8_ | (ulong)!bVar10 * puVar1[1];
      puVar1[2] = (ulong)bVar11 * auVar31._16_8_ | (ulong)!bVar11 * puVar1[2];
      puVar1[3] = (ulong)bVar12 * auVar31._24_8_ | (ulong)!bVar12 * puVar1[3];
      puVar1[4] = (ulong)bVar13 * auVar31._32_8_ | (ulong)!bVar13 * puVar1[4];
      puVar1[5] = (ulong)bVar14 * auVar31._40_8_ | (ulong)!bVar14 * puVar1[5];
      puVar1[6] = (ulong)bVar15 * auVar31._48_8_ | (ulong)!bVar15 * puVar1[6];
      puVar1[7] = (uVar16 >> 7) * auVar31._56_8_ | (ulong)!SUB81(uVar16 >> 7,0) * puVar1[7];
      uVar24 = uVar24 + 8;
    } while ((lVar22 + (ulong)(lVar22 == 0) + 7 & 0xfffffffffffffff8) != uVar24);
  }
  n = (Var *)(**(code **)(*local_d0 + 0x30))(local_d0,lVar3);
  VarSet::VarSet(&local_a0,n);
  ns = (VarSet *)(**(code **)(*local_d0 + 0x50))(local_d0,lVar25);
  Index::Index(&local_80,&local_a0,ns);
  pTVar5 = pTVar5 + sVar17;
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar24 = 0;
    do {
      lVar3 = *(long *)&(pTVar5->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl;
      auVar34._8_8_ = 0;
      auVar34._0_8_ =
           local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar24];
      auVar2._8_8_ = 0;
      auVar2._0_8_ = *(ulong *)(lVar3 + local_80._index * 8);
      auVar2 = vmaxsd_avx(auVar34,auVar2);
      *(long *)(lVar3 + local_80._index * 8) = auVar2._0_8_;
      uVar24 = uVar24 + 1;
      Index::operator++(&local_80);
    } while (uVar24 < (ulong)((long)local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_c8.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  lVar3 = *(long *)&(pTVar5->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl;
  pdVar8 = (pTVar5->_p).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar25 = (long)pdVar8 - lVar3;
  if (lVar25 == 0) {
    dVar33 = 0.0;
  }
  else {
    lVar25 = lVar25 >> 3;
    dVar33 = 0.0;
    lVar21 = 0;
    do {
      dVar33 = dVar33 + *(double *)(lVar3 + lVar21 * 8);
      lVar21 = lVar21 + 1;
    } while (lVar25 + (ulong)(lVar25 == 0) != lVar21);
  }
  lVar25 = (long)pdVar8 - lVar3;
  if (lVar25 != 0) {
    lVar25 = lVar25 >> 3;
    auVar2 = vcvtusi2sd_avx512f(in_XMM4,lVar25);
    auVar35._0_8_ = dVar33 / auVar2._0_8_;
    auVar35._8_8_ = 0;
    auVar29 = vpbroadcastq_avx512f();
    auVar30 = vbroadcastsd_avx512f(auVar35);
    uVar24 = 0;
    auVar31 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar32 = vpbroadcastq_avx512f();
      auVar32 = vporq_avx512f(auVar32,auVar31);
      uVar16 = vpcmpuq_avx512f(auVar32,auVar29,2);
      plVar19 = (long *)(lVar3 + uVar24 * 8);
      auVar32._8_8_ = (ulong)((byte)(uVar16 >> 1) & 1) * plVar19[1];
      auVar32._0_8_ = (ulong)((byte)uVar16 & 1) * *plVar19;
      auVar32._16_8_ = (ulong)((byte)(uVar16 >> 2) & 1) * plVar19[2];
      auVar32._24_8_ = (ulong)((byte)(uVar16 >> 3) & 1) * plVar19[3];
      auVar32._32_8_ = (ulong)((byte)(uVar16 >> 4) & 1) * plVar19[4];
      auVar32._40_8_ = (ulong)((byte)(uVar16 >> 5) & 1) * plVar19[5];
      auVar32._48_8_ = (ulong)((byte)(uVar16 >> 6) & 1) * plVar19[6];
      auVar32._56_8_ = (uVar16 >> 7) * plVar19[7];
      auVar32 = vsubpd_avx512f(auVar32,auVar30);
      puVar1 = (ulong *)(lVar3 + uVar24 * 8);
      bVar9 = (bool)((byte)uVar16 & 1);
      bVar10 = (bool)((byte)(uVar16 >> 1) & 1);
      bVar11 = (bool)((byte)(uVar16 >> 2) & 1);
      bVar12 = (bool)((byte)(uVar16 >> 3) & 1);
      bVar13 = (bool)((byte)(uVar16 >> 4) & 1);
      bVar14 = (bool)((byte)(uVar16 >> 5) & 1);
      bVar15 = (bool)((byte)(uVar16 >> 6) & 1);
      *puVar1 = (ulong)bVar9 * auVar32._0_8_ | (ulong)!bVar9 * *puVar1;
      puVar1[1] = (ulong)bVar10 * auVar32._8_8_ | (ulong)!bVar10 * puVar1[1];
      puVar1[2] = (ulong)bVar11 * auVar32._16_8_ | (ulong)!bVar11 * puVar1[2];
      puVar1[3] = (ulong)bVar12 * auVar32._24_8_ | (ulong)!bVar12 * puVar1[3];
      puVar1[4] = (ulong)bVar13 * auVar32._32_8_ | (ulong)!bVar13 * puVar1[4];
      puVar1[5] = (ulong)bVar14 * auVar32._40_8_ | (ulong)!bVar14 * puVar1[5];
      puVar1[6] = (ulong)bVar15 * auVar32._48_8_ | (ulong)!bVar15 * puVar1[6];
      puVar1[7] = (uVar16 >> 7) * auVar32._56_8_ | (ulong)!SUB81(uVar16 >> 7,0) * puVar1[7];
      uVar24 = uVar24 + 8;
    } while ((lVar25 + (ulong)(lVar25 == 0) + 7 & 0xfffffffffffffff8) != uVar24);
  }
  if (5 < (local_d8->Props).verbose) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\tnew Mess F",0xb);
    poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20," -> v",5);
    poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)poVar20);
    std::__ostream_insert<char,std::char_traits<char>>(poVar20," = ",3);
    poVar20 = libDAI::operator<<(poVar20,(local_d8->_newmessages).
                                         super__Vector_base<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + sVar17);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar20 + -0x18) + (char)poVar20);
    std::ostream::put((char)poVar20);
    std::ostream::flush();
  }
  if (local_80._sum.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80._sum.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80._sum.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80._sum.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80._max.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80._max.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80._max.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80._max.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80._count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80._count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80._count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80._count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a0._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a0._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a0._vars.
                          super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void MaxPlus::calcNewMessage (size_t iI) 
    { 
        const FactorGraph& g = grm();
        //FRANS: iI is the index of the edge in the factorgraph...
        //this function calculates the updated message I->i
        size_t i = g.edge(iI).first;    //FRANS: here we get the index of the variable (? 'first' type) corresponding to edge iI
        size_t I = g.edge(iI).second;   //FRANS: here we get the index of the factor (? the 'second' type) corresponding to edge iI
        ///FRANS: indeed 1st=var, 2nd=Factor, see "typedef BipartiteGraph<Var,Factor> BipFacGraph;" in factorgraph.h, 38
        if( Props.verbose >= 6)
            cout << "new Mess F"<< I <<" -> v"<< i<<endl;

        Prob sum( g.factor(I).p() );

        //if( Props.verbose >= 8)
        //cout<<"\tInitialized sum = " << sum << endl;

        //FRANS: nbF(I)  returns a list to neighbors of Factor I (of the 
        // graph.model) (implementation-wise this list is a vector<size_t> )
        //FRANS: FactorGraph::nb_cit is a typedef provides an iterator of 
        // the list of neighbors
        //Prob & m; //can we make this a reference?
        for( FactorGraph::nb_cit j = g.nbF(I).begin(); j != g.nbF(I).end(); j++ )   
            if( *j != i ) {     // for all j in I \ i                                       
                //if( Props.verbose >= 5)
                    //cout << "\t\tneighbor variable v"<<*j<<" of factor F"<<I<<endl;

                // ind is the precalculated Index(j,I) i.e. to x_I == k corresponds x_j == ind[k]
                _ind_t* ind = &(index(*j,I));
                // sum_j will be the sum of messages coming into j
                Prob sum_j( g.var(*j).states(), 0.0 ); 
                //if( Props.verbose >= 8)
                    //cout << "\t\tInitialized sum_j = "<< sum_j << "(j=" << *j << ")" << endl;

                for( FactorGraph::nb_cit J = g.nbV(*j).begin(); J != g.nbV(*j).end(); J++ ) 
                    if( *J != I ) {     
                        // for all J in nb(j) \ I 
                        //if( Props.verbose >= 5)
                            //cout << "\t\tneighbor factor F"<<*J<<" of variable v"<<*j<<endl;
                        // message(*j,*J) is the (previous) message received by j from J.
                        const Prob & m =  message(*j,*J);
                        //if( Props.verbose >= 5)
                            //cout << "\t\tPrev. message from  F" <<*J<< " -> v" <<*j<< " = " <<m<<endl;
                        sum_j += m;
                        //if( Props.verbose >= 7)
                            //cout << "\t\tsum_j = "<< sum_j <<endl;
                    } 

                // add sum_j to sum
                //if( Props.verbose >= 6)
                    //cout << "\tadding sum_j = "<< sum_j << " to sum = " << sum << endl;
                    
                //we need to add sum_j[k] to all entries sum[r] in sum that are consistent with sum_j[k],
                //i.e., all entries where variable j has state k.
                for( size_t r = 0; r < sum.size(); r++ )
                {
                    //size_t sum_j_index = (*ind)[r];
                    //if( Props.verbose >= 9)
                        //cout << "\t\tr="<<r<<", sum_j_index="<<sum_j_index<<endl;
                    sum[r] += sum_j[(*ind)[r]];
                }
        
            }
     
        //if( Props.verbose >= 6)
            //cout<<"\tsum = " << sum << endl;
        //old slow code....
        //Factor sum_factor ( g.factor( I ).vars(), sum);//create a factor...
        ////...which allows use to easily take the max:
        //Factor max_f = sum_factor.partMax(g.var(i)); //here we take the Max

        //make all changes directly to the new messages:
        Prob & newm = _newmessages[iI];
        //initialize to -infty
        for( size_t i = 0; i < newm.size(); i++)
            newm[i] = -INFINITY;

        //now we compute the max inline (it's an inline version of factor::partMax )
        const VarSet & ns = g.var(i);
        const VarSet & vs = g.factor( I ).vars();
        //Prob res( g.var(i).states(), -INFINITY );
        //Index i_res( ns, vs );
        //for( size_t i = 0; i < sum.size(); i++, ++i_res )
            //res[i_res] = std::max(res[i_res], sum[i]);

        Index i_newm( ns, vs );
        for( size_t i = 0; i < sum.size(); i++, ++i_newm )
            newm[i_newm] = std::max(newm[i_newm], sum[i]);

        //Prob max = max_f.p(); //here we get the desired vector (Prob) repres.
        //Prob & max = res; 
        //if( Props.verbose >= 7)
            //cout << "\t\tsum_factor = "<<sum_factor<<", max = "<<max<<endl;

        // substract average of messages to stop growing
        //size_t s = max.size();
        //double avg = max.totalSum() / s;
        //Prob newm = max - Prob(s, avg); // compute the new normalized message

        double avg = newm.totalSum() / newm.size();
        for( size_t i = 0; i < newm.size(); i++)
            newm[i] -= avg;
        

        // Store result
        //_newmessages[iI] = newm;

        if( Props.verbose >= 6)
            cout << "\tnew Mess F"<< I <<" -> v"<< i<<" = "<<_newmessages[iI]<<endl;
    }